

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TFunction * __thiscall
glslang::TParseContext::findFunction
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  uint uVar1;
  TSymbolTable *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSymbol *pTVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TFunction *pTVar6;
  byte bVar7;
  pool_allocator<char> local_60;
  TString local_58;
  
  pTVar2 = (this->super_TParseContextBase).symbolTable;
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  bVar3 = TSymbolTable::isFunctionNameVariable(pTVar2,(TString *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t use function syntax on variable",
               (((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                CONCAT44(extraout_var_00,iVar4))->_M_dataplus)._M_p,"");
    return (TFunction *)0x0;
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_00,iVar4),"debugPrintfEXT");
  if (bVar3) {
    pTVar2 = (this->super_TParseContextBase).symbolTable;
    local_60.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "debugPrintfEXT(",&local_60);
    pTVar5 = TSymbolTable::find(pTVar2,&local_58,builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar5 != (TSymbol *)0x0) goto LAB_00411574;
  }
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar4),"coopMatPerElementNV");
  if (bVar3) {
    pTVar2 = (this->super_TParseContextBase).symbolTable;
    local_60.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
               "coopMatPerElementNV(",&local_60);
    pTVar5 = TSymbolTable::find(pTVar2,&local_58,builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar5 != (TSymbol *)0x0) {
LAB_00411574:
      iVar4 = (*pTVar5->_vptr_TSymbol[7])(pTVar5);
      return (TFunction *)CONCAT44(extraout_var_02,iVar4);
    }
  }
  iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                    (this,"GL_EXT_shader_explicit_arithmetic_types");
  bVar7 = 1;
  if ((((((char)iVar4 == '\0') &&
        (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                           (this,"GL_EXT_shader_explicit_arithmetic_types_int8"),
        (char)iVar4 == '\0')) &&
       (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int16"),
       (char)iVar4 == '\0')) &&
      ((iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int32"),
       (char)iVar4 == '\0' &&
       (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int64"),
       (char)iVar4 == '\0')))) &&
     ((iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_EXT_shader_explicit_arithmetic_types_float16"),
      (char)iVar4 == '\0' &&
      (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_EXT_shader_explicit_arithmetic_types_float32"),
      (char)iVar4 == '\0')))) {
    iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_explicit_arithmetic_types_float64");
    bVar7 = (byte)iVar4;
  }
  uVar1 = (this->super_TParseContextBase).super_TParseVersions.version;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    if ((bVar7 & 0x135 < (int)uVar1) == 1) {
LAB_0041164d:
      pTVar6 = findFunctionExplicitTypes(this,loc,call,builtIn);
      return pTVar6;
    }
    iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_implicit_conversions");
    if (((char)iVar4 != '\0') &&
       (0x135 < (this->super_TParseContextBase).super_TParseVersions.version)) {
LAB_0041169e:
      pTVar6 = findFunction120(this,loc,call,builtIn);
      return pTVar6;
    }
  }
  else if (0x77 < (int)uVar1) {
    if (uVar1 < 400) {
      iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_gpu_shader_fp64");
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_ARB_gpu_shader5"), (char)iVar4 == '\0')) goto LAB_0041169e;
    }
    else if (bVar7 != 0) goto LAB_0041164d;
    pTVar6 = findFunction400(this,loc,call,builtIn);
    return pTVar6;
  }
  pTVar6 = findFunctionExact(this,loc,call,builtIn);
  return pTVar6;
}

Assistant:

const TFunction* TParseContext::findFunction(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    if (symbolTable.isFunctionNameVariable(call.getName())) {
        error(loc, "can't use function syntax on variable", call.getName().c_str(), "");
        return nullptr;
    }

    const TFunction* function = nullptr;

    // debugPrintfEXT has var args and is in the symbol table as "debugPrintfEXT()",
    // mangled to "debugPrintfEXT("
    if (call.getName() == "debugPrintfEXT") {
        TSymbol* symbol = symbolTable.find("debugPrintfEXT(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    // coopMatPerElementNV is variadic. There is some function signature error
    // checking in handleCoopMat2FunctionCall.
    if (call.getName() == "coopMatPerElementNV") {
        TSymbol* symbol = symbolTable.find("coopMatPerElementNV(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    bool explicitTypesEnabled = extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int8) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int64) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float64);

    if (isEsProfile())
        function = (explicitTypesEnabled && version >= 310)
                   ? findFunctionExplicitTypes(loc, call, builtIn)
                   : ((extensionTurnedOn(E_GL_EXT_shader_implicit_conversions) && version >= 310)
                      ? findFunction120(loc, call, builtIn)
                      : findFunctionExact(loc, call, builtIn));
    else if (version < 120)
        function = findFunctionExact(loc, call, builtIn);
    else if (version < 400) {
        bool needfindFunction400 = extensionTurnedOn(E_GL_ARB_gpu_shader_fp64) || extensionTurnedOn(E_GL_ARB_gpu_shader5);
        function = needfindFunction400 ? findFunction400(loc, call, builtIn) : findFunction120(loc, call, builtIn);
    }
    else if (explicitTypesEnabled)
        function = findFunctionExplicitTypes(loc, call, builtIn);
    else
        function = findFunction400(loc, call, builtIn);

    return function;
}